

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomThreeAction.cpp
# Opt level: O2

ActionResults * __thiscall BlueRoomThreeAction::Throw(BlueRoomThreeAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *this_00;
  ActionResults *pAVar3;
  itemType local_34;
  string local_30;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == BALL) {
    local_34 = BALL;
    this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_34);
    iVar2 = ItemWrapper::getLocation(this_00);
    if (iVar2 == BACKPACK) {
      pAVar3 = (ActionResults *)operator_new(0x30);
      std::__cxx11::string::string
                ((string *)&local_30,
                 "You throw the ball across the room. It clanks around the icy metal pipes for a bit, then rolls to a rest on the frozen floor."
                 ,(allocator *)&local_34);
      ActionResults::ActionResults(pAVar3,CURRENT,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      return pAVar3;
    }
  }
  pAVar3 = AbstractRoomAction::Throw(&this->super_AbstractRoomAction);
  return pAVar3;
}

Assistant:

ActionResults *BlueRoomThreeAction::Throw() {
    if(commands->getMainItem() == BALL && itemList->getValue(BALL)->getLocation() == BACKPACK){
        return new ActionResults(CURRENT, "You throw the ball across the room. It clanks around the icy metal pipes for a bit, then rolls to a rest on the frozen floor.");
    } else {
        return AbstractRoomAction::Throw();
    }
}